

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

char * deqp::gls::(anonymous_namespace)::RandomArrayGenerator::
       createBasicArray<float,deqp::gls::(anonymous_namespace)::GLValue::WrappedType<float>>
                 (int seed,int elementCount,int componentCount,int offset,int stride)

{
  char *pcVar1;
  Float min_00;
  Float FVar2;
  float val;
  GLValue GVar3;
  bool local_e9;
  int local_e8;
  int local_e4;
  int componentNdx_2;
  int componentNdx_1;
  WrappedType<float> local_d4;
  float local_d0;
  WrappedType<float> local_cc;
  float local_c8;
  float local_c4;
  float local_c0;
  int local_bc;
  WrappedType<float> local_b8;
  int componentNdx;
  WrappedType<float> components [4];
  int local_9c;
  undefined1 local_98 [4];
  int vertexNdx;
  deRandom rnd;
  WrappedType<float> previousComponents [4];
  char *local_70;
  char *writePtr;
  char *data;
  size_t bufferSize;
  size_t elementSize;
  size_t componentSize;
  anon_union_8_10_1f5805e9_for_GLValue_1 local_40;
  Float local_34;
  undefined1 local_30 [4];
  WrappedType<float> max;
  WrappedType<float> min;
  int stride_local;
  int offset_local;
  int componentCount_local;
  int elementCount_local;
  int seed_local;
  
  GVar3 = anon_unknown_1::GLValue::getMinValue(INPUTTYPE_FLOAT);
  local_30 = (undefined1  [4])GVar3.type;
  min_00 = extractGLValue<deqp::gls::(anonymous_namespace)::GLValue::WrappedType<float>>
                     ((GLValue *)local_30);
  GVar3 = anon_unknown_1::GLValue::getMaxValue(INPUTTYPE_FLOAT);
  local_40 = GVar3.field_1;
  componentSize._0_4_ = GVar3.type;
  local_34 = extractGLValue<deqp::gls::(anonymous_namespace)::GLValue::WrappedType<float>>
                       ((GLValue *)&componentSize);
  pcVar1 = (char *)operator_new__((long)(offset + (elementCount + -1) * stride) +
                                  (long)componentCount * 4);
  local_70 = pcVar1 + offset;
  deRandom_init((deRandom *)local_98,seed);
  for (local_9c = 0; local_9c < elementCount; local_9c = local_9c + 1) {
    for (local_bc = 0; local_bc < componentCount; local_bc = local_bc + 1) {
      local_c8 = local_34.m_value;
      local_c4 = min_00.m_value;
      local_c0 = (float)getRandom<deqp::gls::(anonymous_namespace)::GLValue::WrappedType<float>>
                                  ((deRandom *)local_98,min_00,local_34);
      (&local_b8)[local_bc].m_value = local_c0;
      local_e9 = false;
      if (local_9c != 0) {
        local_d0 = (float)anon_unknown_1::GLValue::WrappedType<float>::operator-
                                    (&local_b8 + local_bc,previousComponents + (long)local_bc + -2);
        local_cc.m_value =
             (float)abs<deqp::gls::(anonymous_namespace)::GLValue::WrappedType<float>>
                              ((Float)local_d0);
        local_d4.m_value =
             (float)minValue<deqp::gls::(anonymous_namespace)::GLValue::WrappedType<float>>();
        local_e9 = anon_unknown_1::GLValue::WrappedType<float>::operator<(&local_cc,&local_d4);
      }
      if (local_e9 != false) {
        FVar2 = getRandom<deqp::gls::(anonymous_namespace)::GLValue::WrappedType<float>>
                          ((deRandom *)local_98,min_00,local_34);
        (&local_b8)[local_bc].m_value = FVar2.m_value;
      }
    }
    for (local_e4 = 0; local_e4 < componentCount; local_e4 = local_e4 + 1) {
      previousComponents[(long)local_e4 + -2].m_value = (&local_b8)[local_e4].m_value;
    }
    for (local_e8 = 0; local_e8 < componentCount; local_e8 = local_e8 + 1) {
      val = anon_unknown_1::GLValue::WrappedType<float>::getValue(&local_b8 + local_e8);
      anon_unknown_1::alignmentSafeAssignment<float>(local_70 + (long)local_e8 * 4,val);
    }
    local_70 = local_70 + stride;
  }
  return pcVar1;
}

Assistant:

char* RandomArrayGenerator::createBasicArray (int seed, int elementCount, int componentCount, int offset, int stride)
{
	DE_ASSERT(componentCount >= 1 && componentCount <= 4);

	const GLType min = extractGLValue<GLType>(GLValue::getMinValue(GLValueTypeTraits<GLType>::Type));
	const GLType max = extractGLValue<GLType>(GLValue::getMaxValue(GLValueTypeTraits<GLType>::Type));

	const size_t componentSize	= sizeof(T);
	const size_t elementSize	= componentSize * componentCount;
	const size_t bufferSize		= offset + (elementCount - 1) * stride + elementSize;

	char* data = new char[bufferSize];
	char* writePtr = data + offset;

	GLType previousComponents[4];

	deRandom rnd;
	deRandom_init(&rnd, seed);

	for (int vertexNdx = 0; vertexNdx < elementCount; vertexNdx++)
	{
		GLType components[4];

		for (int componentNdx = 0; componentNdx < componentCount; componentNdx++)
		{
			components[componentNdx] = getRandom<GLType>(rnd, min, max);

			// Try to not create vertex near previous
			if (vertexNdx != 0 && abs(components[componentNdx] - previousComponents[componentNdx]) < minValue<GLType>())
			{
				// Too close, try again (but only once)
				components[componentNdx] = getRandom<GLType>(rnd, min, max);
			}
		}

		for (int componentNdx = 0; componentNdx < componentCount; componentNdx++)
			previousComponents[componentNdx] = components[componentNdx];

		for (int componentNdx = 0; componentNdx < componentCount; componentNdx++)
			alignmentSafeAssignment(writePtr + componentNdx*componentSize, components[componentNdx].getValue());

		writePtr += stride;
	}

	return data;
}